

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void simd::Threshold(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                    uint32_t startYOut,uint32_t width,uint32_t height,uint8_t threshold,
                    SIMDType simdType)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ImageTemplate<unsigned_char> *in_RCX;
  uint32_t in_EDX;
  undefined4 in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  uint32_t unaff_retaddr;
  uint in_stack_00000008;
  uint8_t uStack0000000000000010;
  SIMDType in_stack_00000018;
  SIMDType in_stack_00000020;
  uint32_t nonSimdWidth;
  uint32_t totalSimdWidth;
  uint32_t simdWidth;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint32_t simdSize;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff14;
  uint32_t in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff50;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff58;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff60;
  uint32_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint8_t threshold_00;
  uint8_t *in_stack_ffffffffffffff78;
  uint8_t *in_stack_ffffffffffffff80;
  uint8_t *in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff94;
  uint8_t in_stack_ffffffffffffffb7;
  uint8_t *in_stack_ffffffffffffffb8;
  uint8_t *in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  uint32_t in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  uint32_t in_stack_ffffffffffffffd8;
  
  uVar1 = getSimdSize(in_stack_00000020);
  if ((in_stack_00000020 == cpu_function) || (in_stack_00000008 < uVar1)) {
    if (in_stack_00000020 == avx_function) {
      Threshold((Image *)CONCAT44(in_ESI,in_EDX),(uint32_t)((ulong)in_RCX >> 0x20),(uint32_t)in_RCX,
                (Image *)CONCAT44(in_R8D,in_R9D),uVar1,in_stack_ffffffffffffffd8,unaff_retaddr,
                in_stack_00000008,uStack0000000000000010,in_stack_00000018);
    }
    else {
      Image_Function::Threshold
                ((Image *)CONCAT44(in_R8D,in_R9D),uVar1,in_stack_ffffffffffffffd8,
                 (Image *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_EDX,(uint32_t)in_RDI,
                 (uint8_t)unaff_retaddr);
    }
  }
  else {
    uVar3 = in_stack_00000008;
    Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
              (in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20),
               (uint32_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               (uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               (uint32_t)in_stack_ffffffffffffff28,in_stack_ffffffffffffff50,
               (uint32_t)in_stack_ffffffffffffff58);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff14,_uStack0000000000000010),
               (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff0c,uVar3));
    Image_Function::
    VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
              ((ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff14,_uStack0000000000000010),
               (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff0c,uVar3));
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x17c31c);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff14,_uStack0000000000000010),
               (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff0c,uVar3));
    Image_Function::
    OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
              ((uint32_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x17c36b);
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
    threshold_00 = (uint8_t)(uVar2 >> 0x18);
    PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
    PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
    uVar1 = (in_stack_00000008 / uVar1) * uVar1;
    if (in_stack_00000020 == avx_function) {
      avx::Threshold(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7,
                     uVar1,in_stack_00000008 - uVar1,in_stack_ffffffffffffff20);
    }
    else if (in_stack_00000020 == sse_function) {
      sse::Threshold(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,threshold_00,
                     (uint32_t)outYEnd,(uint32_t)outY,(uint32_t)inY);
    }
  }
  return;
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t threshold, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width < simdSize) ) {
            AVX_CODE( Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, threshold, sse_function ); )

            Image_Function::Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, threshold );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyGrayScaleImage( in, out );

        Image_Function::OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, threshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, threshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, threshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }